

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontext.cpp
# Opt level: O2

void __thiscall CGameContext::SendVoteSet(CGameContext *this,int Type,int ToClientID)

{
  long lVar1;
  int64 iVar2;
  int64 iVar3;
  long in_FS_OFFSET;
  CNetMsg_Sv_VoteSet local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = this->m_VoteCloseTime;
  local_40.m_Type = Type;
  if (lVar1 == 0) {
    local_40.m_ClientID = this->m_VoteCreator;
    local_40.m_pDescription = "";
    local_40.m_Timeout = 0;
    local_40.m_pReason = "";
  }
  else {
    local_40.m_ClientID = this->m_VoteCreator;
    iVar2 = time_get();
    iVar3 = time_freq();
    local_40.m_Timeout = (int)((lVar1 - iVar2) / iVar3);
    local_40.m_pDescription = this->m_aVoteDescription;
    local_40.m_pReason = this->m_aVoteReason;
  }
  IServer::SendPackMsg<CNetMsg_Sv_VoteSet>(this->m_pServer,&local_40,1,ToClientID);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGameContext::SendVoteSet(int Type, int ToClientID)
{
	CNetMsg_Sv_VoteSet Msg;
	if(m_VoteCloseTime)
	{
		Msg.m_ClientID = m_VoteCreator;
		Msg.m_Type = Type;
		Msg.m_Timeout = (m_VoteCloseTime-time_get())/time_freq();
		Msg.m_pDescription = m_aVoteDescription;
		Msg.m_pReason = m_aVoteReason;
	}
	else
	{
		Msg.m_Type = Type;
		Msg.m_Timeout = 0;
		Msg.m_ClientID = m_VoteCreator;
		Msg.m_pDescription = "";
		Msg.m_pReason = "";
	}
	Server()->SendPackMsg(&Msg, MSGFLAG_VITAL, ToClientID);
}